

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O2

void __thiscall
embree::TutorialApplication::TutorialApplication
          (TutorialApplication *this,string *tutorialName,int features,int w,int h)

{
  CommandLineParser *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
  *this_01;
  atomic<unsigned_long> *paVar1;
  double dVar2;
  CommandLineOption *pCVar3;
  mapped_type *pmVar4;
  allocator local_d2;
  allocator local_d1;
  Ref<embree::CommandLineParser::CommandLineOption> closure;
  string local_b8 [32];
  key_type local_98;
  string local_78;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  Averaged<double> *local_48;
  string *local_40;
  Averaged<double> *local_38;
  
  Application::Application(&this->super_Application,features);
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__TutorialApplication_002aadf8;
  this->window = (GLFWwindow *)0x0;
  local_40 = &this->tutorialName;
  std::__cxx11::string::string((string *)local_40,(string *)tutorialName);
  (this->animated_camera).ptr = (PerspectiveCameraNode *)0x0;
  *(undefined8 *)&(this->camera).from.field_0 = 0x38d1b71738d1b717;
  *(undefined8 *)((long)&(this->camera).from.field_0 + 8) = 0xc0400000;
  *(undefined8 *)&(this->camera).to.field_0 = 0;
  *(undefined8 *)((long)&(this->camera).to.field_0 + 8) = 0;
  *(undefined8 *)&(this->camera).up.field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(this->camera).up.field_0 + 8) = 0;
  (this->camera).fov = 90.0;
  (this->camera).handedness = RIGHT_HANDED;
  this->width = w;
  this->height = h;
  this->pixels = (uint *)0x0;
  FileName::FileName(&this->outputImageFilename,"");
  FileName::FileName(&this->referenceImageFilename,"");
  this->referenceImageThreshold = 35.0;
  this->numFrames = 1;
  this->interactive = true;
  this->fullscreen = false;
  this->window_width = 0x400;
  this->window_height = 0x400;
  dVar2 = getSeconds();
  this->time0 = dVar2;
  this->debug_int0 = 0;
  this->debug_int1 = 0;
  this->mouseMode = 0;
  this->clickX = 0.0;
  this->clickY = 0.0;
  *(undefined8 *)&this->speed = 0x3f800000;
  *(undefined8 *)((long)&(this->moveDelta).field_0 + 4) = 0;
  this->animate = true;
  this->render_time = 0.0;
  this->command_line_camera = false;
  this->print_frame_rate = false;
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  _Deque_base((_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
              )&this->avg_render_time);
  (this->avg_render_time).N = 0x40;
  (this->avg_render_time).dt = 1.0;
  local_38 = &this->avg_frame_time;
  local_48 = &this->avg_render_time;
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  _Deque_base((_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
              )local_38);
  (this->avg_frame_time).N = 0x40;
  (this->avg_frame_time).dt = 1.0;
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  _Deque_base((_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
              )&this->avg_mrayps);
  (this->avg_mrayps).N = 0x40;
  (this->avg_mrayps).dt = 1.0;
  this->print_camera = false;
  this->debug0 = 0;
  this->debug1 = 0;
  this->debug2 = 0;
  this->debug3 = 0;
  this->iflags_coherent = RTC_RAY_QUERY_FLAG_COHERENT;
  this->iflags_incoherent = RTC_RAY_QUERY_FLAG_INCOHERENT;
  (this->ispc_scene)._M_t.
  super___uniq_ptr_impl<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>._M_t.
  super__Tuple_impl<0UL,_embree::ISPCScene_*,_std::default_delete<embree::ISPCScene>_>.
  super__Head_base<0UL,_embree::ISPCScene_*,_false>._M_head_impl = (ISPCScene *)0x0;
  local_4c = MXCSR;
  local_54 = MXCSR | 0x8000;
  MXCSR = MXCSR | 0x8040;
  instance = this;
  local_58 = MXCSR;
  local_50 = local_54;
  std::__cxx11::string::string((string *)&local_98,"c",&local_d1);
  std::__cxx11::string::string
            (local_b8,"-c <filename>: parses command line option from <filename>",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  this_00 = &(this->super_Application).commandLineParser;
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002aaf08;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  this_01 = &(this->super_Application).commandLineParser.commandLineOptionMap;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"o",&local_d1);
  std::__cxx11::string::string(local_b8,"-o <filename>: output image filename",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002aaf58;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"compare",&local_d1);
  std::__cxx11::string::string
            (local_b8,"--compare <filename>: reference image to compare against",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002aafa8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"compare-threshold",&local_d1);
  std::__cxx11::string::string
            (local_b8,
             "--compare-threshold <float>: threshold in number of wrong pixels when image is considered wrong"
             ,&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002aaff8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"frames",&local_d1);
  std::__cxx11::string::string
            (local_b8,"--frames <int>: number of frames to render in compare or output mode",
             &local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab048;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"vp",&local_d1);
  std::__cxx11::string::string(local_b8,"--vp <float> <float> <float>: camera position",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab098;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"vi",&local_d1);
  std::__cxx11::string::string
            (local_b8,"--vi <float> <float> <float>: camera lookat position",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab0e8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"vd",&local_d1);
  std::__cxx11::string::string
            (local_b8,"--vd <float> <float> <float>: camera direction vector",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab138;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"vu",&local_d1);
  std::__cxx11::string::string(local_b8,"--vu <float> <float> <float>: camera up vector",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab188;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"fov",&local_d1);
  std::__cxx11::string::string(local_b8,"--fov <float>: vertical field of view",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab1d8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"lefthanded",&local_d1);
  std::__cxx11::string::string(local_b8,"--lefthanded: use left handed coordinates",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab228;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"righthanded",&local_d1);
  std::__cxx11::string::string(local_b8,"--righthanded: use right handed coordinates",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab278;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"size",&local_d1);
  std::__cxx11::string::string(local_b8,"--size <width> <height>: sets image size",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab2c8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"fullscreen",&local_d1);
  std::__cxx11::string::string(local_b8,"--fullscreen: starts in fullscreen mode",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab318;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"print-frame-rate",&local_d1);
  std::__cxx11::string::string
            (local_b8,"--print-frame-rate: prints framerate for each frame on console",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab368;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"print-camera",&local_d1);
  std::__cxx11::string::string
            (local_b8,"--print-camera: prints camera for each frame on console",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab3b8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"debug0",&local_d1);
  std::__cxx11::string::string(local_b8,"--debug0: sets internal debugging value",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab408;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"debug1",&local_d1);
  std::__cxx11::string::string(local_b8,"--debug1: sets internal debugging value",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab458;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"debug2",&local_d1);
  std::__cxx11::string::string(local_b8,"--debug2: sets internal debugging value",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab4a8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"debug3",&local_d1);
  std::__cxx11::string::string(local_b8,"--debug3: sets internal debugging value",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab4f8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"time",&local_d1);
  std::__cxx11::string::string(local_b8,"--time: sets time for motion blur",&local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab548;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"coherent",&local_d1);
  std::__cxx11::string::string
            (local_b8,"--coherent: force using RTC_RAY_QUERY_FLAG_COHERENT hint when tracing rays",
             &local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab598;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"incoherent",&local_d1);
  std::__cxx11::string::string
            (local_b8,
             "--incoherent: force using RTC_RAY_QUERY_FLAG_INCOHERENT hint when tracing rays",
             &local_d2);
  pCVar3 = (CommandLineOption *)::operator_new(0x38);
  std::__cxx11::string::string((string *)&local_78,local_b8);
  CommandLineParser::CommandLineOption::CommandLineOption(pCVar3,&local_78);
  (pCVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002ab5e8;
  pCVar3[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar3->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  closure.ptr = pCVar3;
  std::__cxx11::string::~string((string *)&local_78);
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&closure);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_98);
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar4->ptr != (CommandLineOption *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = closure.ptr;
  if (closure.ptr != (CommandLineOption *)0x0) {
    (*((closure.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

TutorialApplication::TutorialApplication (const std::string& tutorialName, int features, int w, int h)

    : Application(features),
      tutorialName(tutorialName),

      width(w),
      height(h),
      pixels(nullptr),

      outputImageFilename(""),
      referenceImageFilename(""),
      referenceImageThreshold(35.0f),

      interactive(true),
      fullscreen(false),

      window_width(1024),
      window_height(1024),

      time0(getSeconds()),
      debug_int0(0),
      debug_int1(0),

      mouseMode(0),
      clickX(0.0), clickY(0.0),
      speed(1.0f),
      moveDelta(zero),

      animate(true),
      render_time(0.f),

      command_line_camera(false),
      print_frame_rate(false),
      avg_render_time(64,1.0),
      avg_frame_time(64,1.0),
      avg_mrayps(64,1.0),
      print_camera(false),

      debug0(0),
      debug1(0),
      debug2(0),
      debug3(0),

      iflags_coherent(RTC_RAY_QUERY_FLAG_COHERENT),
      iflags_incoherent(RTC_RAY_QUERY_FLAG_INCOHERENT)
  {
    /* only a single instance of this class is supported */
    assert(instance == nullptr);
    instance = this;

    /* for best performance set FTZ and DAZ flags in MXCSR control and status register */
    _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_ON);
    _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_ON);

    registerOption("c", [this] (Ref<ParseStream> cin, const FileName& path) {
        FileName file = path + cin->getFileName();
        parseCommandLine(new ParseStream(new LineCommentFilter(file, "#")), file.path());
      }, "-c <filename>: parses command line option from <filename>");

    registerOption("o", [this] (Ref<ParseStream> cin, const FileName& path) {
        outputImageFilename = cin->getFileName();
        interactive = false;
      }, "-o <filename>: output image filename");

    registerOption("compare", [this] (Ref<ParseStream> cin, const FileName& path) {
        referenceImageFilename = cin->getFileName();
        interactive = false;
      }, "--compare <filename>: reference image to compare against");

    registerOption("compare-threshold", [this] (Ref<ParseStream> cin, const FileName& path) {
        referenceImageThreshold = cin->getFloat();
      }, "--compare-threshold <float>: threshold in number of wrong pixels when image is considered wrong");

    registerOption("frames", [this] (Ref<ParseStream> cin, const FileName& path) {
        numFrames = cin->getInt();
      }, "--frames <int>: number of frames to render in compare or output mode");

    /* camera settings */
    registerOption("vp", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.from = cin->getVec3fa();
        command_line_camera = true;
      }, "--vp <float> <float> <float>: camera position");

    registerOption("vi", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.to = cin->getVec3fa();
        command_line_camera = true;
      }, "--vi <float> <float> <float>: camera lookat position");

    registerOption("vd", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.to = camera.from + cin->getVec3fa();
        command_line_camera = true;
      }, "--vd <float> <float> <float>: camera direction vector");

    registerOption("vu", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.up = cin->getVec3fa();
        command_line_camera = true;
      }, "--vu <float> <float> <float>: camera up vector");

    registerOption("fov", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.fov = cin->getFloat();
        command_line_camera = true;
      }, "--fov <float>: vertical field of view");

    registerOption("lefthanded", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.handedness = Camera::LEFT_HANDED;
      }, "--lefthanded: use left handed coordinates");

    registerOption("righthanded", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.handedness = Camera::RIGHT_HANDED;
      }, "--righthanded: use right handed coordinates");

    /* framebuffer settings */
    registerOption("size", [this] (Ref<ParseStream> cin, const FileName& path) {
        width = cin->getInt();
        height = cin->getInt();
      }, "--size <width> <height>: sets image size");

    registerOption("fullscreen", [this] (Ref<ParseStream> cin, const FileName& path) {
        fullscreen = true;
      }, "--fullscreen: starts in fullscreen mode");

    registerOption("print-frame-rate", [this] (Ref<ParseStream> cin, const FileName& path) {
        print_frame_rate = true;
      }, "--print-frame-rate: prints framerate for each frame on console");

     registerOption("print-camera", [this] (Ref<ParseStream> cin, const FileName& path) {
         print_camera = true;
      }, "--print-camera: prints camera for each frame on console");

     registerOption("debug0", [this] (Ref<ParseStream> cin, const FileName& path) {
         debug0 = cin->getInt();
       }, "--debug0: sets internal debugging value");

     registerOption("debug1", [this] (Ref<ParseStream> cin, const FileName& path) {
         debug1 = cin->getInt();
       }, "--debug1: sets internal debugging value");

     registerOption("debug2", [this] (Ref<ParseStream> cin, const FileName& path) {
         debug2 = cin->getInt();
       }, "--debug2: sets internal debugging value");

     registerOption("debug3", [this] (Ref<ParseStream> cin, const FileName& path) {
         debug3 = cin->getInt();
       }, "--debug3: sets internal debugging value");

     registerOption("time", [this] (Ref<ParseStream> cin, const FileName& path) {
         g_motion_blur = false;
         animate = false;
         render_time = cin->getFloat();
         g_debug = render_time;
       }, "--time: sets time for motion blur");

    registerOption("coherent", [this] (Ref<ParseStream> cin, const FileName& path) {
        g_iflags_coherent   = iflags_coherent   = RTC_RAY_QUERY_FLAG_COHERENT;
        g_iflags_incoherent = iflags_incoherent = RTC_RAY_QUERY_FLAG_COHERENT;
      }, "--coherent: force using RTC_RAY_QUERY_FLAG_COHERENT hint when tracing rays");

    registerOption("incoherent", [this] (Ref<ParseStream> cin, const FileName& path) {
        g_iflags_coherent   = iflags_coherent   = RTC_RAY_QUERY_FLAG_INCOHERENT;
        g_iflags_incoherent = iflags_incoherent = RTC_RAY_QUERY_FLAG_INCOHERENT;
      }, "--incoherent: force using RTC_RAY_QUERY_FLAG_INCOHERENT hint when tracing rays");

#if defined(EMBREE_SYCL_TUTORIAL)
    registerOption("jit-cache", [this] (Ref<ParseStream> cin, const FileName& path) {
         jit_cache = cin->getInt();
       }, "--jit-cache <0/1>: enabled (1) or disables (0) JIT caching");
#endif
  }